

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

bool __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
multiple_select_enabled
          (list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  byte bVar1;
  auto_mutex *in_RDI;
  auto_mutex M;
  rmutex *in_stack_ffffffffffffffc8;
  
  auto_mutex::auto_mutex(in_RDI,in_stack_ffffffffffffffc8);
  bVar1 = *(byte *)&in_RDI[0xc3].rw;
  auto_mutex::~auto_mutex((auto_mutex *)0x44e90a);
  return (bool)(bVar1 & 1);
}

Assistant:

bool list_box<S>::
    multiple_select_enabled (
    ) const
    {
        auto_mutex M(m);
        return ms_enabled;
    }